

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_thread.cpp
# Opt level: O0

void __thiscall tst_thread::then(tst_thread *this)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> t1;
  byte bVar1;
  bool bVar2;
  QThread *t2;
  QPromise<int> *in_RCX;
  PromiseData<int> **local_80;
  long local_78;
  QFuture<void> local_70;
  QPromise<void> local_60;
  QPromiseBase<void> local_50;
  PromiseData<int> *local_40;
  QThread *target;
  anon_class_8_1_6bb45959 aStack_30;
  int value;
  undefined1 local_28 [8];
  QPromise<int> p;
  QThread *source;
  tst_thread *this_local;
  
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  aStack_30.source = (QThread **)&p.super_QPromiseBase<int>.m_d;
  QtPromise::QPromise<int>::QPromise<tst_thread::then()::__1>
            ((QPromise<int> *)local_28,&stack0xffffffffffffffd0);
  target._4_4_ = -1;
  local_40 = (PromiseData<int> *)0x0;
  local_80 = &local_40;
  local_78 = (long)&target + 4;
  QtConcurrent::run<tst_thread::then()::__0,QtPromise::QPromise<int>&>
            (&local_70,(QtConcurrent *)&local_80,
             (anon_class_16_2_77a2518b_for__M_head_impl *)local_28,in_RCX);
  QtPromise::resolve<QFuture<void>>((QtPromise *)&local_60,&local_70);
  QtPromise::QPromiseBase<void>::wait(&local_50,&local_60);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_50);
  QtPromise::QPromise<void>::~QPromise(&local_60);
  QFuture<void>::~QFuture(&local_70);
  bVar1 = QTest::qVerify(local_40 != (PromiseData<int> *)0x0,"target != nullptr","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x7c);
  if (((bVar1 & 1) != 0) &&
     (bVar1 = QTest::qVerify(p.super_QPromiseBase<int>.m_d.d != local_40,"source != target","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                             ,0x7d), t1 = p.super_QPromiseBase<int>.m_d, (bVar1 & 1) != 0)) {
    t2 = (QThread *)QThread::currentThread();
    bVar2 = QTest::qCompare<QThread>
                      ((QThread *)t1.d,t2,"source","QThread::currentThread()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                       ,0x7e);
    if (bVar2) {
      QTest::qCompare(target._4_4_,0x2a,"value","42",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                      ,0x7f);
    }
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_28);
  return;
}

Assistant:

void tst_thread::then()
{
    QThread* source = nullptr;
    QtPromise::QPromise<int> p{[&](const QtPromise::QPromiseResolve<int>& resolve) {
        source = QThread::currentThread();
        resolve(42);
    }};

    int value = -1;
    QThread* target = nullptr;
    QtPromise::resolve(QtConcurrent::run(
                           [&](const QtPromise::QPromise<int>& p) {
                               p.then([&](int res) {
                                    target = QThread::currentThread();
                                    value = res;
                                }).wait();
                           },
                           p))
        .wait();

    QVERIFY(target != nullptr);
    QVERIFY(source != target);
    QCOMPARE(source, QThread::currentThread());
    QCOMPARE(value, 42);
}